

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O1

UGroup * re2::LookupGroup(StringPiece *name,UGroup *groups,int ngroups)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  StringPiece local_30;
  
  if (0 < ngroups) {
    uVar4 = (ulong)(uint)ngroups;
    do {
      local_30.ptr_ = groups->name;
      iVar2 = 0;
      if (local_30.ptr_ != (char *)0x0) {
        sVar3 = strlen(local_30.ptr_);
        iVar2 = (int)sVar3;
      }
      local_30.length_ = iVar2;
      bVar1 = StringPiece::_equal(&local_30,name);
      if (bVar1) {
        return groups;
      }
      groups = groups + 1;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  return (UGroup *)0x0;
}

Assistant:

static const UGroup* LookupGroup(const StringPiece& name,
                                 const UGroup *groups, int ngroups) {
  // Simple name lookup.
  for (int i = 0; i < ngroups; i++)
    if (StringPiece(groups[i].name) == name)
      return &groups[i];
  return NULL;
}